

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_c_b94.c
# Opt level: O0

void hyb_mgga_xc_b94_hyb_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  xc_func_type *p_00;
  char *name;
  double par;
  double cx;
  double cab;
  double css;
  double gamma;
  
  get_ext_param(in_RDI,in_RSI,0);
  p_00 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,1);
  name = (char *)get_ext_param(in_RDI,in_RSI,2);
  par = get_ext_param(in_RDI,in_RSI,3);
  xc_func_set_ext_params_name(p_00,name,par);
  xc_func_set_ext_params_name(p_00,name,par);
  xc_func_set_ext_params_name(p_00,name,par);
  xc_func_set_ext_params_name(p_00,name,par);
  xc_func_set_ext_params_name(p_00,name,par);
  *in_RDI->mix_coef = 1.0 - par;
  in_RDI->mix_coef[1] = 1.0;
  in_RDI->cam_alpha = par;
  return;
}

Assistant:

static void
hyb_mgga_xc_b94_hyb_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double gamma, css, cab, cx;

  assert(p != NULL);

  gamma = get_ext_param(p, ext_params, 0);
  css = get_ext_param(p, ext_params, 1);
  cab = get_ext_param(p, ext_params, 2);
  cx = get_ext_param(p, ext_params, 3);

  xc_func_set_ext_params_name(p->func_aux[0], "_at", 0.0);
  xc_func_set_ext_params_name(p->func_aux[0], "_gamma", gamma);
  xc_func_set_ext_params_name(p->func_aux[1], "_gamma", gamma);
  xc_func_set_ext_params_name(p->func_aux[1], "_css", css);
  xc_func_set_ext_params_name(p->func_aux[1], "_cab", cab);

  p->mix_coef[0] = 1.0 - cx;
  p->mix_coef[1] = 1.0;

  p->cam_alpha = cx;
}